

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_outputstream.cc
# Opt level: O2

Future<int> * __thiscall
CrailOutputstream::Write
          (Future<int> *__return_storage_ptr__,CrailOutputstream *this,
          shared_ptr<crail::ByteBuffer> *buf)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  unsigned_long_long uVar4;
  element_type *peVar5;
  AsyncTask<GetblockResponse> AVar6;
  ostream *poVar7;
  BlockInfo *this_00;
  uint uVar8;
  uint uVar9;
  shared_ptr<StorageClient> storage_client;
  GetblockResponse get_block_res;
  __shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2> local_170;
  DatanodeInfo local_160;
  Future<GetblockResponse> local_140;
  GetblockResponse local_c8;
  BlockInfo local_70;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"CrailOutputstream::Write buf->remaining ");
  peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,peVar3->limit_ - peVar3->position_)
  ;
  std::endl<char,std::char_traits<char>>(poVar7);
  peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = peVar3->position_;
  iVar2 = peVar3->limit_;
  if ((iVar2 - iVar1 < 0) || (iVar2 == iVar1)) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_0013b398
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = true;
    __return_storage_ptr__->result_ = -1;
  }
  else {
    uVar4 = this->position_;
    uVar8 = (uint)uVar4;
    uVar9 = 0x100000 - (uVar8 & 0xfffff);
    if (uVar9 < (uint)(iVar2 - iVar1)) {
      peVar3->limit_ = uVar9 + iVar1;
    }
    this_00 = BlockCache::GetBlock
                        ((this->block_cache_).
                         super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr,uVar4);
    if (((this_00->datanode_info_).ip_address_ == 0) || ((this_00->datanode_info_).port_ == 0)) {
      peVar5 = (this->namenode_client_).
               super___shared_ptr<NamenodeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_NamenodeClient[4])
                (&local_140,peVar5,(this->file_info_).fd_,(this->file_info_).token_,this->position_,
                 this->position_);
      Future<GetblockResponse>::get(&local_c8,&local_140);
      Future<GetblockResponse>::~Future(&local_140);
      if (local_c8.super_NamenodeResponse.error_ < 0) {
        (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask =
             (_func_int **)&PTR_get_0013b398;
        (__return_storage_ptr__->task_).
        super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (__return_storage_ptr__->task_).
        super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __return_storage_ptr__->is_done_ = true;
        __return_storage_ptr__->result_ = -1;
      }
      else {
        BlockInfo::operator=(this_00,&local_c8.block_info_);
        local_70._vptr_BlockInfo = (_func_int **)&PTR__BlockInfo_0013ca58;
        local_70.datanode_info_._vptr_DatanodeInfo = (_func_int **)&PTR__DatanodeInfo_0013ca18;
        local_70.datanode_info_.storage_type_ = (this_00->datanode_info_).storage_type_;
        local_70.datanode_info_.storage_class_ = (this_00->datanode_info_).storage_class_;
        local_70.datanode_info_.location_class_ = (this_00->datanode_info_).location_class_;
        local_70.datanode_info_.ip_address_ = (this_00->datanode_info_).ip_address_;
        local_70.datanode_info_.port_ = (this_00->datanode_info_).port_;
        local_70.lba_ = this_00->lba_;
        local_70.addr_ = this_00->addr_;
        local_70.length_ = this_00->length_;
        local_70.lkey_ = this_00->lkey_;
        BlockCache::PutBlock
                  ((this->block_cache_).super___shared_ptr<BlockCache,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,this->position_,&local_70);
        BlockInfo::~BlockInfo(&local_70);
      }
      GetblockResponse::~GetblockResponse(&local_c8);
      if (local_c8.super_NamenodeResponse.error_ < 0) {
        return __return_storage_ptr__;
      }
    }
    peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this->position_ = this->position_ + ((long)peVar3->limit_ - (long)peVar3->position_);
    local_140.super_AsyncTask<GetblockResponse>._vptr_AsyncTask =
         (_func_int **)&PTR__DatanodeInfo_0013ca18;
    local_140.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)&(this_00->datanode_info_).storage_type_;
    local_140.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          &(this_00->datanode_info_).location_class_;
    local_140.result_.super_NamenodeResponse.super_RpcMessage._vptr_RpcMessage._0_4_ =
         (this_00->datanode_info_).port_;
    DatanodeInfo::~DatanodeInfo((DatanodeInfo *)&local_140);
    local_140.super_AsyncTask<GetblockResponse>._vptr_AsyncTask =
         (_func_int **)&PTR__DatanodeInfo_0013ca18;
    local_140.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)&(this_00->datanode_info_).storage_type_;
    local_140.task_.super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          &(this_00->datanode_info_).location_class_;
    local_140.result_.super_NamenodeResponse.super_RpcMessage._vptr_RpcMessage._0_4_ =
         (this_00->datanode_info_).port_;
    DatanodeInfo::~DatanodeInfo((DatanodeInfo *)&local_140);
    local_160._vptr_DatanodeInfo = (_func_int **)&PTR__DatanodeInfo_0013ca18;
    local_160.storage_type_ = (this_00->datanode_info_).storage_type_;
    local_160.storage_class_ = (this_00->datanode_info_).storage_class_;
    local_160.location_class_ = (this_00->datanode_info_).location_class_;
    local_160.ip_address_ = (this_00->datanode_info_).ip_address_;
    local_160.port_ = (this_00->datanode_info_).port_;
    StorageCache::Get((StorageCache *)&local_140,
                      (DatanodeInfo *)
                      (this->storage_cache_).
                      super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    DatanodeInfo::~DatanodeInfo(&local_160);
    AVar6._vptr_AsyncTask = local_140.super_AsyncTask<GetblockResponse>._vptr_AsyncTask;
    uVar4 = this_00->addr_;
    iVar1 = this_00->lkey_;
    std::__shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_170,&buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*AVar6._vptr_AsyncTask + 0x10))
              (__return_storage_ptr__,AVar6._vptr_AsyncTask,iVar1,(uVar8 & 0xfffff) + uVar4,
               &local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
    peVar3 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar3->position_ = peVar3->limit_;
    peVar3->limit_ = iVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_140.task_);
  }
  return __return_storage_ptr__;
}

Assistant:

Future<int> CrailOutputstream::Write(shared_ptr<ByteBuffer> buf) {
  cout << "CrailOutputstream::Write buf->remaining " << buf->remaining()
       << endl;
  if (buf->remaining() < 0) {
    return Future<int>::Failure(-1);
  }
  if (buf->remaining() == 0) {
    return Future<int>::Failure(-1);
  }

  int block_offset = position_ % kBlockSize;
  int block_remaining = kBlockSize - block_offset;
  int buf_original_limit = buf->limit();

  if (block_remaining < buf->remaining()) {
    buf->set_limit(buf->position() + block_remaining);
  }

  BlockInfo &block_info = block_cache_->GetBlock(position_);
  if (!block_info.valid()) {
    GetblockResponse get_block_res =
        namenode_client_
            ->GetBlock(file_info_.fd(), file_info_.token(), position_,
                       position_)
            .get();

    if (get_block_res.error() < 0) {
      return Future<int>::Failure(-1);
    }

    block_info = get_block_res.block_info();
    block_cache_->PutBlock(position_, block_info);
  }

  this->position_ += buf->remaining();
  int address = block_info.datanode().addr();
  int port = block_info.datanode().port();

  shared_ptr<StorageClient> storage_client =
      storage_cache_->Get(block_info.datanode());
  long long block_addr = block_info.addr() + block_offset;
  Future<int> storage_response =
      storage_client->WriteData(block_info.lkey(), block_addr, buf);

  buf->set_position(buf->position() + buf->remaining());
  buf->set_limit(buf_original_limit);

  return storage_response;
}